

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_dump_codec(opj_codec_t *p_codec,OPJ_INT32 info_flag,FILE *output_stream)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  opj_codec_private_t *l_codec;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"[ERROR] Input parameter of the dump_codec function are incorrect.\n");
  }
  else {
    (**(code **)(in_RDI + 0x68))(*(undefined8 *)(in_RDI + 0x50),in_ESI,in_RDX);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_dump_codec(	opj_codec_t *p_codec,
									OPJ_INT32 info_flag,
									FILE* output_stream)
{
	if (p_codec) {
		opj_codec_private_t* l_codec = (opj_codec_private_t*) p_codec;

		l_codec->opj_dump_codec(l_codec->m_codec, info_flag, output_stream);
		return;
	}

	fprintf(stderr, "[ERROR] Input parameter of the dump_codec function are incorrect.\n");
	return;
}